

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O3

unique_ptr<SequenceReader<Protein>,_std::default_delete<SequenceReader<Protein>_>_>
DetectFileFormatAndOpenReader<Protein>(string *path,FileFormat defaultFormat)

{
  FileFormat FVar1;
  SequenceReader<Protein> *this;
  undefined **ppuVar2;
  undefined4 in_register_00000034;
  string *filepath;
  
  filepath = (string *)CONCAT44(in_register_00000034,defaultFormat);
  FVar1 = InferFileFormat(filepath,FASTA);
  if (FVar1 == FASTQ) {
    this = (SequenceReader<Protein> *)operator_new(0x10);
    SequenceReader<Protein>::SequenceReader(this,filepath);
    ppuVar2 = &PTR_operator>>_00198ed0;
    this->_vptr_SequenceReader = (_func_int **)&PTR_operator>>_00198ed0;
  }
  else {
    this = (SequenceReader<Protein> *)operator_new(0x30);
    SequenceReader<Protein>::SequenceReader(this,filepath);
    this->_vptr_SequenceReader = (_func_int **)&PTR_operator>>_00198f48;
    ppuVar2 = (undefined **)(this + 2);
    this[1]._vptr_SequenceReader = (_func_int **)ppuVar2;
    this[1].mTextReader._M_t.super___uniq_ptr_impl<TextReader,_std::default_delete<TextReader>_>.
    _M_t.super__Tuple_impl<0UL,_TextReader_*,_std::default_delete<TextReader>_>.
    super__Head_base<0UL,_TextReader_*,_false>._M_head_impl = (TextReader *)0x0;
    *(undefined1 *)&this[2]._vptr_SequenceReader = 0;
  }
  (path->_M_dataplus)._M_p = (pointer)this;
  return (unique_ptr<SequenceReader<Protein>,_std::default_delete<SequenceReader<Protein>_>_>)
         ppuVar2;
}

Assistant:

static std::unique_ptr< SequenceReader < A > > DetectFileFormatAndOpenReader( const std::string &path, const FileFormat defaultFormat ) {
  switch( InferFileFormat( path, defaultFormat ) ) {
    case FileFormat::FASTQ:
      return std::unique_ptr< SequenceReader< A > >(
        new FASTQ::Reader< A >( path ) );

    default:
      return std::unique_ptr< SequenceReader< A > >(
        new FASTA::Reader< A >( path ) );
  }
}